

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_59::InMemoryFile::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  Maybe<kj::_::Mutex::Waiter_&> local_20;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd8
             ,&((this->ref).ptr)->impl);
  *(uint *)&local_20.ptr[1].next.ptr = *(uint *)&local_20.ptr[1].next.ptr - 1;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd8);
  Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own(&this->ref);
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                     size_t capacity, void (*destroyElement)(void*)) const override {
      delete this;
    }